

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O1

void upscale_flow_component(double *flow,int cur_width,int cur_height,int stride,double *tmpbuf)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  int iVar7;
  double *row;
  int iVar8;
  long lVar9;
  ulong uVar10;
  double *pdVar11;
  double *pdVar12;
  ulong uVar13;
  double *pdVar14;
  ulong uVar15;
  double dVar16;
  long local_68;
  int local_60;
  
  lVar2 = (long)stride;
  if (0 < cur_height) {
    local_60 = -2;
    local_68 = -0x100000000;
    uVar10 = 0;
    do {
      if (0 < cur_width) {
        uVar15 = 0;
        lVar9 = local_68;
        iVar7 = local_60;
        do {
          dVar16 = 0.0;
          lVar3 = 0;
          iVar8 = iVar7;
          do {
            dVar16 = dVar16 + flow[iVar8] * *(double *)((long)flow_upscale_filter[0] + lVar3);
            lVar3 = lVar3 + 8;
            iVar8 = iVar8 + 1;
          } while (lVar3 != 0x20);
          tmpbuf[uVar10 * lVar2 + uVar15 * 2] = dVar16 + dVar16;
          dVar16 = 0.0;
          lVar4 = 0;
          lVar3 = lVar9;
          do {
            dVar16 = dVar16 + *(double *)((long)flow + (lVar3 >> 0x1d)) *
                              flow_upscale_filter[1][lVar4];
            lVar3 = lVar3 + 0x100000000;
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          tmpbuf[(int)uVar15 * 2 + (int)(uVar10 * lVar2) + 1] = dVar16 + dVar16;
          uVar15 = uVar15 + 1;
          iVar7 = iVar7 + 1;
          lVar9 = lVar9 + 0x100000000;
        } while (uVar15 != (uint)cur_width);
      }
      uVar10 = uVar10 + 1;
      local_60 = local_60 + stride;
      local_68 = local_68 + (lVar2 << 0x20);
    } while (uVar10 != (uint)cur_height);
  }
  uVar1 = cur_width * 2;
  pdVar5 = tmpbuf + lVar2 * -2;
  lVar9 = 2;
  do {
    memcpy(pdVar5,tmpbuf,(long)(int)uVar1 << 3);
    pdVar5 = pdVar5 + lVar2;
    lVar9 = lVar9 + -1;
  } while (lVar9 != 0);
  pdVar5 = tmpbuf + cur_height * lVar2;
  lVar9 = 2;
  do {
    memcpy(pdVar5,tmpbuf + stride * (cur_height + -1),(long)(int)uVar1 << 3);
    pdVar5 = pdVar5 + lVar2;
    lVar9 = lVar9 + -1;
  } while (lVar9 != 0);
  if (0 < cur_height) {
    uVar10 = 1;
    if (1 < (int)uVar1) {
      uVar10 = (ulong)uVar1;
    }
    pdVar5 = tmpbuf + lVar2 * -2;
    pdVar6 = tmpbuf + -lVar2;
    uVar15 = 0;
    do {
      if (0 < cur_width) {
        uVar13 = 0;
        pdVar11 = pdVar6;
        pdVar12 = pdVar5;
        do {
          dVar16 = 0.0;
          lVar9 = 0;
          pdVar14 = pdVar12;
          do {
            dVar16 = dVar16 + *pdVar14 * *(double *)((long)flow_upscale_filter[0] + lVar9);
            lVar9 = lVar9 + 8;
            pdVar14 = pdVar14 + lVar2;
          } while (lVar9 != 0x20);
          flow[uVar15 * 2 * lVar2 + uVar13] = dVar16;
          dVar16 = 0.0;
          lVar9 = 0;
          pdVar14 = pdVar11;
          do {
            dVar16 = dVar16 + *pdVar14 * flow_upscale_filter[1][lVar9];
            pdVar14 = pdVar14 + lVar2;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          flow[(uVar15 * 2 + 1) * lVar2 + uVar13] = dVar16;
          uVar13 = uVar13 + 1;
          pdVar12 = pdVar12 + 1;
          pdVar11 = pdVar11 + 1;
        } while (uVar13 != uVar10);
      }
      uVar15 = uVar15 + 1;
      pdVar5 = pdVar5 + lVar2;
      pdVar6 = pdVar6 + lVar2;
    } while (uVar15 != (uint)cur_height);
  }
  return;
}

Assistant:

static void upscale_flow_component(double *flow, int cur_width, int cur_height,
                                   int stride, double *tmpbuf) {
  const int half_len = FLOW_UPSCALE_TAPS / 2;

  // Check that the outer border is large enough to avoid needing to clamp
  // the source locations
  assert(half_len <= FLOW_BORDER_OUTER);

  // Horizontal upscale and multiply by 2
  for (int i = 0; i < cur_height; i++) {
    for (int j = 0; j < cur_width; j++) {
      double left = 0;
      for (int k = -half_len; k < half_len; k++) {
        left +=
            flow[i * stride + (j + k)] * flow_upscale_filter[0][k + half_len];
      }
      tmpbuf[i * stride + (2 * j + 0)] = 2.0 * left;

      // Right output pixel is 0.25 units to the right of the input pixel
      double right = 0;
      for (int k = -(half_len - 1); k < (half_len + 1); k++) {
        right += flow[i * stride + (j + k)] *
                 flow_upscale_filter[1][k + (half_len - 1)];
      }
      tmpbuf[i * stride + (2 * j + 1)] = 2.0 * right;
    }
  }

  // Fill in top and bottom borders of tmpbuf
  const double *top_row = &tmpbuf[0];
  for (int i = -FLOW_BORDER_OUTER; i < 0; i++) {
    double *row = &tmpbuf[i * stride];
    memcpy(row, top_row, 2 * cur_width * sizeof(*row));
  }

  const double *bottom_row = &tmpbuf[(cur_height - 1) * stride];
  for (int i = cur_height; i < cur_height + FLOW_BORDER_OUTER; i++) {
    double *row = &tmpbuf[i * stride];
    memcpy(row, bottom_row, 2 * cur_width * sizeof(*row));
  }

  // Vertical upscale
  int upscaled_width = cur_width * 2;
  for (int i = 0; i < cur_height; i++) {
    for (int j = 0; j < upscaled_width; j++) {
      double top = 0;
      for (int k = -half_len; k < half_len; k++) {
        top +=
            tmpbuf[(i + k) * stride + j] * flow_upscale_filter[0][k + half_len];
      }
      flow[(2 * i) * stride + j] = top;

      double bottom = 0;
      for (int k = -(half_len - 1); k < (half_len + 1); k++) {
        bottom += tmpbuf[(i + k) * stride + j] *
                  flow_upscale_filter[1][k + (half_len - 1)];
      }
      flow[(2 * i + 1) * stride + j] = bottom;
    }
  }
}